

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int runtest(int i)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *__file;
  int *piVar6;
  char *pcVar7;
  undefined8 extraout_RDX;
  char *pcVar8;
  ulong uVar9;
  stat buf;
  stat64 sStack_1e8;
  stat64 *psStack_158;
  testDesc *ptStack_150;
  ulong uStack_148;
  code *pcStack_140;
  long local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  long local_118;
  char *local_110;
  glob64_t local_108;
  stat64 local_c0;
  
  local_11c = nb_errors;
  local_124 = nb_tests;
  local_120 = nb_leaks;
  if ((tests_quiet == '\0') && (testDescriptions[i].desc != (char *)0x0)) {
    pcStack_140 = (code *)0x1062cf;
    printf("## %s\n");
  }
  pcStack_140 = (code *)0x1062e8;
  lVar4 = xmlGetCharEncodingHandler(6);
  pcStack_140 = (code *)0x1062f5;
  local_118 = xmlGetCharEncodingHandler(0x15);
  if (testDescriptions[i].in == (char *)0x0) {
    testErrorsSize = 0;
    testErrors[0] = '\0';
    extraMemoryFromResolver = 0;
    pcStack_140 = (code *)0x10661c;
    iVar1 = (*testDescriptions[i].func)
                      ((char *)0x0,(char *)0x0,(char *)0x0,testDescriptions[i].options);
    if (iVar1 != 0) {
      nb_errors = nb_errors + 1;
    }
  }
  else {
    local_108.gl_offs = 0;
    pcStack_140 = (code *)0x106324;
    glob64(testDescriptions[i].in,8,(__errfunc *)0x0,&local_108);
    if (local_108.gl_pathc != 0) {
      local_128 = 0;
      uVar9 = 0;
      local_130 = lVar4;
      do {
        pcStack_140 = (code *)0x10635c;
        iVar1 = stat64(local_108.gl_pathv[uVar9],&local_c0);
        if ((iVar1 != -1) && ((local_c0.st_mode & 0xf000) == 0x8000)) {
          if (lVar4 == 0) {
            pcStack_140 = (code *)0x1063c3;
            pcVar5 = strstr(local_108.gl_pathv[uVar9],"ebcdic");
            if (pcVar5 != (char *)0x0) goto LAB_001065ac;
          }
          if (local_118 == 0) {
            pcStack_140 = (code *)0x1063e3;
            pcVar5 = strstr(local_108.gl_pathv[uVar9],"icu_parse_test");
            if (pcVar5 != (char *)0x0) goto LAB_001065ac;
          }
          if (testDescriptions[i].suffix == (char *)0x0) {
            pcVar5 = (char *)0x0;
          }
          else {
            pcVar7 = local_108.gl_pathv[uVar9];
            pcVar8 = testDescriptions[i].out;
            pcStack_140 = (code *)0x1063a1;
            pcVar5 = resultFilename(pcVar7,pcVar8,testDescriptions[i].suffix);
            if (pcVar5 == (char *)0x0) {
              pcStack_140 = (code *)0x1066aa;
              runtest_cold_1();
              goto LAB_001066aa;
            }
          }
          if (testDescriptions[i].err == (char *)0x0) {
            __file = (char *)0x0;
          }
          else {
            pcVar7 = local_108.gl_pathv[uVar9];
            pcVar8 = testDescriptions[i].out;
            pcStack_140 = (code *)0x10640b;
            __file = resultFilename(pcVar7,pcVar8,testDescriptions[i].err);
            if (__file == (char *)0x0) {
LAB_001066aa:
              pcStack_140 = testExternalEntityLoader;
              runtest_cold_2();
              psStack_158 = &local_c0;
              ptStack_150 = testDescriptions + i;
              uStack_148 = uVar9;
              pcStack_140 = (code *)pcVar5;
              iVar1 = stat64(pcVar7,&sStack_1e8);
              if ((iVar1 != -1) && ((sStack_1e8.st_mode & 0xf000) == 0x8000)) {
                iVar1 = xmlNoNetExternalEntityLoader(pcVar7,pcVar8,extraout_RDX);
                return iVar1;
              }
              iVar1 = xmlMemUsed();
              iVar2 = xmlNoNetExternalEntityLoader(pcVar7,pcVar8,extraout_RDX);
              iVar3 = xmlMemUsed();
              extraMemoryFromResolver = extraMemoryFromResolver + (iVar3 - iVar1);
              return iVar2;
            }
          }
          if (pcVar5 == (char *)0x0) {
LAB_00106458:
            if (__file != (char *)0x0) {
              pcStack_140 = (code *)0x106468;
              iVar1 = stat64(__file,&local_c0);
              if ((iVar1 == -1 || (local_c0.st_mode & 0xf000) != 0x8000) &&
                 ((update_results & 1) == 0)) {
                pcVar8 = "Missing error file %s\n";
                pcVar7 = __file;
                goto LAB_001065e6;
              }
            }
            pcStack_140 = (code *)0x10649a;
            iVar1 = xmlMemUsed();
            extraMemoryFromResolver = 0;
            testErrorsSize = 0;
            testErrors[0] = '\0';
            pcStack_140 = (code *)0x1064d3;
            iVar2 = (*testDescriptions[i].func)
                              (local_108.gl_pathv[uVar9],pcVar5,__file,
                               testDescriptions[i].options | 0x10000);
            pcStack_140 = (code *)0x1064db;
            xmlResetLastError();
            if (iVar2 == 0) {
              pcStack_140 = (code *)0x1064e5;
              iVar2 = xmlMemUsed();
              if (iVar2 != iVar1) {
                pcStack_140 = (code *)0x1064f6;
                iVar2 = xmlMemUsed();
                __stream = _stderr;
                if ((iVar2 != iVar1) && (extraMemoryFromResolver == 0)) {
                  local_110 = local_108.gl_pathv[uVar9];
                  pcStack_140 = (code *)0x106521;
                  iVar2 = xmlMemUsed();
                  pcStack_140 = (code *)0x10653f;
                  fprintf(__stream,"File %s leaked %d bytes\n",local_110,
                          (ulong)(uint)(iVar2 - iVar1));
                  piVar6 = &nb_leaks;
                  goto LAB_00106573;
                }
              }
            }
            else {
              pcStack_140 = (code *)0x106569;
              fprintf(_stderr,"File %s generated an error\n",local_108.gl_pathv[uVar9]);
              piVar6 = &nb_errors;
LAB_00106573:
              *piVar6 = *piVar6 + 1;
              local_128 = local_128 + 1;
            }
            testErrorsSize = 0;
            lVar4 = local_130;
          }
          else {
            pcStack_140 = (code *)0x10642b;
            iVar1 = stat64(pcVar5,&local_c0);
            if ((iVar1 != -1 && (local_c0.st_mode & 0xf000) == 0x8000) ||
               ((update_results & 1) != 0)) goto LAB_00106458;
            pcVar8 = "Missing result file %s\n";
            pcVar7 = pcVar5;
LAB_001065e6:
            pcStack_140 = (code *)0x1065ed;
            fprintf(_stderr,pcVar8,pcVar7);
          }
          if (pcVar5 != (char *)0x0) {
            pcStack_140 = (code *)0x10659a;
            free(pcVar5);
          }
          if (__file != (char *)0x0) {
            pcStack_140 = (code *)0x1065a7;
            free(__file);
          }
        }
LAB_001065ac:
        uVar9 = uVar9 + 1;
      } while (uVar9 < local_108.gl_pathc);
    }
    pcStack_140 = (code *)0x1065f9;
    globfree64(&local_108);
  }
  pcStack_140 = (code *)0x10662e;
  xmlCharEncCloseFunc(lVar4);
  pcStack_140 = (code *)0x106638;
  iVar1 = xmlCharEncCloseFunc(local_118);
  if (verbose == '\x01') {
    if (nb_leaks == local_120 && nb_errors == local_11c) {
      pcStack_140 = (code *)0x10667d;
      iVar1 = printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - local_124));
    }
    else {
      pcStack_140 = (code *)0x106693;
      iVar1 = printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - local_124),
                     (ulong)(uint)(nb_errors - local_11c),(ulong)(uint)(nb_leaks - local_120));
    }
  }
  return iVar1;
}

Assistant:

static int
runtest(int i) {
    int ret = 0, res;
    int old_errors, old_tests, old_leaks;

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    if ((tests_quiet == 0) && (testDescriptions[i].desc != NULL))
	printf("## %s\n", testDescriptions[i].desc);
    res = launchTests(&testDescriptions[i]);
    if (res != 0)
	ret++;
    if (verbose) {
	if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	    printf("Ran %d tests, no errors\n", nb_tests - old_tests);
	else
	    printf("Ran %d tests, %d errors, %d leaks\n",
		   nb_tests - old_tests,
		   nb_errors - old_errors,
		   nb_leaks - old_leaks);
    }
    return(ret);
}